

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.cpp
# Opt level: O0

hmac * __thiscall
hmac::get_hmac(hmac *this,string *key_input,string *msg,TypeHash type,bool is_hex,bool is_upper)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170 [36];
  byte local_14c;
  byte local_14b;
  byte local_14a;
  byte local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  string local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  string local_e8 [32];
  ulong local_c8;
  size_t i;
  string okeypad;
  string local_a0 [8];
  string ikeypad;
  string local_70 [32];
  string local_50 [8];
  string key;
  ulong local_30;
  size_t block_size;
  bool is_upper_local;
  bool is_hex_local;
  TypeHash type_local;
  string *msg_local;
  string *key_input_local;
  
  if (type == SHA1) {
    local_30 = 0x40;
  }
  else if (type == SHA256) {
    local_30 = 0x40;
  }
  else {
    if (type != SHA512) {
      std::__cxx11::string::string((string *)this);
      return this;
    }
    local_30 = 0x80;
  }
  std::__cxx11::string::string(local_50,(string *)key_input);
  uVar1 = std::__cxx11::string::size();
  if (local_30 < uVar1) {
    get_hash(local_70,(TypeHash)local_50);
    std::__cxx11::string::operator=(local_50,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  uVar1 = std::__cxx11::string::size();
  if (uVar1 < local_30) {
    std::__cxx11::string::resize((ulong)local_50,(char)local_30);
  }
  std::__cxx11::string::string(local_a0);
  std::__cxx11::string::string((string *)&i);
  std::__cxx11::string::reserve((ulong)local_a0);
  std::__cxx11::string::reserve((ulong)&i);
  for (local_c8 = 0; local_c8 < local_30; local_c8 = local_c8 + 1) {
    std::__cxx11::string::operator[]((ulong)local_50);
    std::__cxx11::string::push_back((char)local_a0);
    std::__cxx11::string::operator[]((ulong)local_50);
    std::__cxx11::string::push_back((char)&i);
  }
  local_149 = 0;
  local_14a = 0;
  local_14b = 0;
  local_14c = 0;
  if (is_hex) {
    std::operator+(local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    local_149 = 1;
    get_hash(local_128,(TypeHash)local_148);
    local_14a = 1;
    std::operator+(local_108,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                  );
    local_14b = 1;
    get_hash(local_e8,(TypeHash)local_108);
    local_14c = 1;
    to_hex(this,local_e8,is_upper);
  }
  else {
    std::operator+(local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    get_hash(local_190,(TypeHash)local_1b0);
    std::operator+(local_170,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                  );
    get_hash((string *)this,(TypeHash)local_170);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  if ((local_14c & 1) != 0) {
    std::__cxx11::string::~string((string *)local_e8);
  }
  if ((local_14b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_108);
  }
  if ((local_14a & 1) != 0) {
    std::__cxx11::string::~string((string *)local_128);
  }
  if ((local_149 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_148);
  }
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

std::string get_hmac(const std::string& key_input, const std::string &msg, TypeHash type, bool is_hex, bool is_upper) {
        size_t block_size = 0;
        switch(type) {
        case TypeHash::SHA1:
            block_size = hmac_hash::SHA1::BLOCK_SIZE;
            break;
        case TypeHash::SHA256:
            block_size = hmac_hash::SHA256::SHA224_256_BLOCK_SIZE;
            break;
        case TypeHash::SHA512:
            block_size = hmac_hash::SHA512::SHA384_512_BLOCK_SIZE;
            break;
        default:
            return std::string();
        };

        std::string key = key_input;
        
        if(key.size() > block_size) {
            /* If key length > block size, hash it and pad with zeros to block size */
            key = get_hash(key, type);
        }
        if(key.size() < block_size) {
            /* Pad key with zeros if it's shorter than block size */
            key.resize(block_size, '\0');
        }
        
        /* If key length == block size, use it as is */
        std::string ikeypad;
        std::string okeypad;
        
        ikeypad.reserve(block_size);
        okeypad.reserve(block_size);
        
        for(size_t i = 0; i < block_size; ++i) {
            ikeypad.push_back(0x36 ^ key[i]);
            okeypad.push_back(0x5c ^ key[i]);
        }

        return is_hex 
            ? to_hex(get_hash(okeypad + get_hash(ikeypad + msg, type), type), is_upper) 
            : get_hash(okeypad + get_hash(ikeypad + msg, type), type);
    }